

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O1

ES5ArrayTypeHandler * __thiscall
Js::NullTypeHandlerBase::ConvertToES5ArrayType(NullTypeHandlerBase *this,DynamicObject *instance)

{
  int *piVar1;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar2;
  
  pEVar2 = ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>(this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertNullToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  return pEVar2;
}

Assistant:

ES5ArrayTypeHandler* NullTypeHandlerBase::ConvertToES5ArrayType(DynamicObject * instance)
    {
        ES5ArrayTypeHandler* newTypeHandler = ConvertToTypeHandler<ES5ArrayTypeHandler>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertNullToDictionaryCount++;
#endif
        return newTypeHandler;
    }